

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer pMVar5;
  unsigned_long uVar6;
  void *pvVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  pointer pvVar10;
  int iVar11;
  pointer pBVar12;
  pointer __n;
  float *pfVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  pointer pfVar17;
  int i;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  int j;
  Mat *pMVar23;
  ulong uVar24;
  int q;
  pointer pBVar25;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float fVar30;
  undefined1 auVar29 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar39;
  float fVar41;
  undefined1 in_XMM2 [16];
  undefined1 auVar37 [16];
  float fVar40;
  float fVar42;
  undefined1 auVar38 [16];
  float fVar43;
  float fVar44;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> all_bbox_rects;
  float confidence;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  int local_19c;
  size_t local_190;
  vector<float,_std::allocator<float>_> all_bbox_scores;
  pointer local_150;
  pointer local_148;
  pointer local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_box_bbox_scores;
  float local_d8;
  float fStack_d4;
  undefined1 extraout_var [12];
  
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar16 = 0;
  do {
    if ((ulong)((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 6) <= uVar16) {
      if (all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_start !=
          all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl
          .super__Vector_impl_data._M_finish) {
        if (all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          qsort_descent_inplace<ncnn::BBoxRect>
                    (&all_bbox_rects,&all_bbox_scores,0,
                     (int)((ulong)((long)all_bbox_scores.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)all_bbox_scores.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2) + -1);
        }
      }
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fVar1 = this->nms_threshold;
      __n = (pointer)(((long)all_bbox_rects.
                             super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)all_bbox_rects.
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x14);
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&bbox_rects,(size_type)__n,
                 (allocator_type *)&bbox_scores);
      pfVar13 = &(all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start)->xmax;
      for (pfVar17 = (pointer)0x0; __n != pfVar17; pfVar17 = (pointer)((long)pfVar17 + 1)) {
        uVar2 = ((BBoxRect *)(pfVar13 + -2))->xmin;
        uVar4 = ((BBoxRect *)(pfVar13 + -2))->ymin;
        (&(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
           super__Vector_impl_data._M_start)->xmin)[(long)pfVar17] =
             ((float)((ulong)*(undefined8 *)pfVar13 >> 0x20) - (float)uVar4) *
             ((float)*(undefined8 *)pfVar13 - (float)uVar2);
        pfVar13 = pfVar13 + 5;
      }
      for (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start = (pointer)0x0;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start < __n;
          bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl
                               .super__Vector_impl_data._M_start + 1)) {
        pBVar25 = all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                  (long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
        uVar21 = (ulong)((long)picked.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)picked.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar16 = uVar21 & 0xffffffff;
        if ((int)uVar21 < 1) {
          uVar16 = 0;
        }
        uVar21 = 1;
        for (uVar22 = 0; uVar16 != uVar22; uVar22 = uVar22 + 1) {
          uVar6 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar22];
          fVar32 = pBVar25->xmin;
          fVar34 = all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar6].xmax;
          fVar43 = 0.0;
          if (fVar32 <= fVar34) {
            pBVar12 = all_bbox_rects.
                      super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar6;
            fVar35 = pBVar25->xmax;
            fVar39 = pBVar12->xmin;
            if (fVar39 <= fVar35) {
              fVar40 = pBVar25->ymin;
              fVar41 = pBVar12->ymax;
              if (fVar40 <= fVar41) {
                fVar42 = pBVar25->ymax;
                fVar44 = pBVar12->ymin;
                if (fVar44 <= fVar42) {
                  if (fVar35 <= fVar34) {
                    fVar34 = fVar35;
                  }
                  if (fVar39 <= fVar32) {
                    fVar39 = fVar32;
                  }
                  if (fVar42 <= fVar41) {
                    fVar41 = fVar42;
                  }
                  if (fVar44 <= fVar40) {
                    fVar44 = fVar40;
                  }
                  fVar43 = (fVar41 - fVar44) * (fVar34 - fVar39);
                }
              }
            }
          }
          if (fVar1 < fVar43 / (((&(bbox_rects.
                                    super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->xmin)
                                 [(long)bbox_scores.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start] - fVar43) +
                               (&(bbox_rects.
                                  super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->xmin)[uVar6])) {
            uVar21 = 0;
          }
        }
        if ((int)uVar21 != 0) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    (&picked,(value_type_conflict5 *)&bbox_scores);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&bbox_rects);
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar16 = 0;
          uVar16 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar16 = uVar16 + 1
          ) {
        uVar6 = picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16];
        std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                  (&bbox_rects,
                   all_bbox_rects.
                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar6);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&bbox_scores,
                   all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar6);
      }
      uVar16 = ((long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x14;
      iVar18 = (int)uVar16;
      if (iVar18 == 0) {
        iVar11 = 0;
      }
      else {
        pMVar23 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(pMVar23,6,iVar18,4,opt->blob_allocator);
        pvVar7 = pMVar23->data;
        iVar11 = -100;
        if ((pvVar7 != (void *)0x0) && ((long)pMVar23->c * pMVar23->cstep != 0)) {
          iVar11 = 0;
          uVar16 = uVar16 & 0xffffffff;
          if (iVar18 < 1) {
            uVar16 = 0;
          }
          piVar14 = &(bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_start)->label;
          for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
            fVar1 = bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21];
            lVar20 = (long)(int)uVar21 * (long)pMVar23->w * pMVar23->elemsize;
            *(float *)((long)pvVar7 + lVar20) = (float)(*piVar14 + 1);
            *(float *)((long)pvVar7 + lVar20 + 4) = fVar1;
            *(float *)((long)pvVar7 + lVar20 + 8) = ((BBoxRect *)(piVar14 + -4))->xmin;
            *(int *)((long)pvVar7 + lVar20 + 0xc) = piVar14[-3];
            *(int *)((long)pvVar7 + lVar20 + 0x10) = piVar14[-2];
            *(int *)((long)pvVar7 + lVar20 + 0x14) = piVar14[-1];
            piVar14 = piVar14 + 5;
          }
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00156191:
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::~_Vector_base
                (&all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                );
      return iVar11;
    }
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_box_bbox_scores.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
              *)&bbox_scores,(long)this->num_box);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&all_box_bbox_scores,(long)this->num_box);
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar18 = this->num_box;
    iVar11 = pMVar5[uVar16].c / iVar18;
    if (iVar11 != this->num_class + 5) {
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&all_box_bbox_scores);
      std::
      vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                 *)&bbox_scores);
      iVar11 = -1;
      goto LAB_00156191;
    }
    pMVar23 = pMVar5 + uVar16;
    lVar20 = (long)iVar18;
    uVar21._0_4_ = pMVar23->w;
    uVar21._4_4_ = pMVar23->h;
    fVar32 = (float)(int)(undefined4)uVar21;
    fVar34 = (float)uVar21._4_4_;
    auVar37._4_4_ = fVar34;
    auVar37._0_4_ = fVar32;
    auVar37._8_8_ = 0;
    auVar37 = rcpps(in_XMM2,auVar37);
    fVar1 = *(float *)((long)(this->anchors_scale).data + uVar16 * 4);
    fVar43 = auVar37._0_4_;
    fVar39 = auVar37._4_4_;
    fVar41 = auVar37._8_4_;
    fVar42 = auVar37._12_4_;
    auVar9._4_4_ = (float)(int)(fVar1 * fVar34);
    auVar9._0_4_ = (float)(int)(fVar1 * fVar32);
    auVar9._8_4_ = (float)(int)(fVar1 * 0.0);
    auVar9._12_4_ = (float)(int)(fVar1 * 0.0);
    in_XMM2 = rcpps(auVar37,auVar9);
    fVar35 = in_XMM2._0_4_;
    fVar40 = in_XMM2._4_4_;
    uVar22 = uVar21 & 0xffffffff;
    if ((int)(undefined4)uVar21 < 1) {
      uVar22 = 0;
    }
    if (uVar21._4_4_ < 1) {
      uVar21._4_4_ = 0;
    }
    for (lVar15 = 0; lVar15 < iVar18; lVar15 = lVar15 + 1) {
      iVar18 = (int)lVar15 * iVar11;
      uVar3 = *(undefined8 *)
               ((long)(this->biases).data +
               (long)((int)*(float *)((long)(this->mask).data + lVar15 * 4 + lVar20 * uVar16 * 4) *
                     2) * 4);
      Mat::channel((Mat *)&bbox_rects,pMVar23,iVar18);
      pBVar25 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar23,iVar18 + 1);
      local_140 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar23,iVar18 + 2);
      local_148 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar23,iVar18 + 3);
      local_150 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel((Mat *)&bbox_rects,pMVar23,iVar18 + 4);
      pBVar12 = bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&bbox_rects);
      Mat::channel_range((Mat *)&bbox_rects,pMVar23,iVar18 + 5,this->num_class);
      local_d8 = (float)uVar3;
      fStack_d4 = (float)((ulong)uVar3 >> 0x20);
      fVar44 = fStack_d4 * 0.5;
      for (iVar18 = 0; iVar18 != uVar21._4_4_; iVar18 = iVar18 + 1) {
        fVar33 = fVar44;
        for (uVar24 = 0; uVar24 != uVar22; uVar24 = uVar24 + 1) {
          fVar27 = expf(-pBVar12->xmin);
          fVar33 = -3.4028235e+38;
          uVar19 = 0;
          for (uVar26 = 0; (long)uVar26 < (long)this->num_class; uVar26 = uVar26 + 1) {
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((long)&(bbox_rects.
                                   super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->xmin +
                          local_190 * uVar26 *
                          (long)bbox_rects.
                                super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)bbox_rects.
                          super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            fVar36 = *(float *)((long)picked.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                               uVar24 * 4 +
                               (long)(local_19c * iVar18) *
                               (long)bbox_rects.
                                     super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Mat::~Mat((Mat *)&picked);
            bVar8 = fVar33 < fVar36;
            if (fVar33 <= fVar36) {
              fVar33 = fVar36;
            }
            if (bVar8) {
              uVar19 = uVar26 & 0xffffffff;
            }
          }
          in_XMM2 = ZEXT416((uint)(fVar27 + 1.0));
          fVar33 = expf(-fVar33);
          confidence = 1.0 / ((fVar33 + 1.0) * (fVar27 + 1.0));
          fVar33 = extraout_XMM0_Db;
          if (this->confidence_threshold <= confidence) {
            fVar33 = local_148->xmin;
            fVar27 = local_150->xmin;
            fVar36 = local_140->xmin;
            fVar28 = expf(-pBVar25->xmin);
            auVar29._0_4_ = expf(-fVar36);
            auVar29._4_12_ = extraout_var;
            auVar38._0_4_ = fVar28 + 1.0;
            auVar38._4_4_ = auVar29._0_4_ + 1.0;
            auVar38._8_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar38._12_4_ = extraout_var._0_4_ + 0.0;
            auVar37 = rcpps(auVar29,auVar38);
            fVar36 = auVar37._0_4_;
            fVar28 = auVar37._4_4_;
            fVar30 = auVar37._8_4_;
            fVar31 = auVar37._12_4_;
            fVar36 = ((float)(int)uVar24 + fVar36 + (1.0 - auVar38._0_4_ * fVar36) * fVar36) *
                     ((1.0 - fVar32 * fVar43) * fVar43 + fVar43);
            fVar28 = ((float)iVar18 + fVar28 + (1.0 - auVar38._4_4_ * fVar28) * fVar28) *
                     ((1.0 - fVar34 * fVar39) * fVar39 + fVar39);
            fVar27 = expf(fVar27);
            fVar33 = expf(fVar33);
            fVar33 = fVar33 * local_d8 * 0.5 *
                     ((1.0 - (float)(int)(fVar1 * fVar32) * fVar35) * fVar35 + fVar35);
            fVar27 = fVar27 * fStack_d4 * 0.5 *
                     ((1.0 - (float)(int)(fVar1 * fVar34) * fVar40) * fVar40 + fVar40);
            in_XMM2._4_4_ = fVar28;
            in_XMM2._0_4_ = fVar36;
            in_XMM2._8_4_ =
                 (extraout_XMM0_Db + fVar30 + (0.0 - auVar38._8_4_ * fVar30) * fVar30) *
                 ((0.0 - fVar41 * 0.0) * fVar41 + fVar41);
            in_XMM2._12_4_ =
                 (fVar44 + fVar31 + (0.0 - auVar38._12_4_ * fVar31) * fVar31) *
                 ((0.0 - fVar42 * 0.0) * fVar42 + fVar42);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)CONCAT44(fVar28 - fVar27,fVar36 - fVar33);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)CONCAT44(fVar27 + fVar28,fVar33 + fVar36);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)CONCAT44(picked.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   (int)uVar19);
            std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::push_back
                      ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)
                       (bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar15 * 6),(value_type *)&picked);
            std::vector<float,_std::allocator<float>_>::push_back
                      (all_box_bbox_scores.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar15,&confidence);
            fVar33 = extraout_XMM0_Db_01;
          }
          pBVar25 = (pointer)&pBVar25->ymin;
          local_140 = (pointer)&local_140->ymin;
          local_148 = (pointer)&local_148->ymin;
          local_150 = (pointer)&local_150->ymin;
          pBVar12 = (pointer)&pBVar12->ymin;
        }
        fVar44 = fVar33;
      }
      Mat::~Mat((Mat *)&bbox_rects);
      iVar18 = this->num_box;
    }
    lVar20 = 8;
    for (lVar15 = 0;
        pvVar10 = all_box_bbox_scores.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, lVar15 < iVar18; lVar15 = lVar15 + 1) {
      std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
      insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>,void>
                ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20 + -8),
                 *(BBoxRect **)
                  ((long)bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar20));
      std::vector<float,std::allocator<float>>::
      insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>,void>
                ((vector<float,std::allocator<float>> *)&all_bbox_scores,
                 (const_iterator)
                 all_bbox_scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)((long)pvVar10 + lVar20 + -8),
                 (__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_>)
                 *(float **)
                  ((long)&(pvVar10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar20));
      iVar18 = this->num_box;
      lVar20 = lVar20 + 0x18;
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&all_box_bbox_scores);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
               *)&bbox_scores);
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;
    std::vector<float> all_bbox_scores;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector< std::vector<BBoxRect> > all_box_bbox_rects;
        std::vector< std::vector<float> > all_box_bbox_scores;
        all_box_bbox_rects.resize(num_box);
        all_box_bbox_scores.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
#pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {


                    // box score
                    float box_score = sigmoid(box_score_ptr[0]);

                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -std::numeric_limits<float>::max();
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
                    class_score = sigmoid(class_score);

                    //printf( "%d %f %f\n", class_index, box_score, class_score);

                    float confidence = box_score * class_score;
                    if (confidence >= confidence_threshold)
                    {
                                            // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;
                        
                        BBoxRect c = { bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, class_index };
                        all_box_bbox_rects[pp].push_back(c);
                        all_box_bbox_scores[pp].push_back(confidence);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }



        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];
            const std::vector<float>& box_bbox_scores = all_box_bbox_scores[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
            all_bbox_scores.insert(all_bbox_scores.end(), box_bbox_scores.begin(), box_bbox_scores.end());
        }

    }
    

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects, all_bbox_scores);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
        bbox_scores.push_back(all_bbox_scores[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1);// +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}